

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

bool __thiscall
SharedMemRingBuffer::InitIndexBuffer(SharedMemRingBuffer *this,key_t key_index_buffer,size_t size)

{
  bool bVar1;
  void *pvVar2;
  _PositionInfo_ **pp_Var3;
  YieldingWaitStrategy *this_00;
  StatusOnSharedMem *status_on_shared_mem;
  ulong in_RDX;
  long in_RDI;
  size_t i;
  char *buffer_start;
  bool bSharedMemFirstCreated;
  bool *in_stack_00000130;
  size_t in_stack_00000138;
  key_t in_stack_00000144;
  SharedMemoryManager *in_stack_00000148;
  StatusOnSharedMem *in_stack_ffffffffffffff88;
  RingBuffer<_PositionInfo__*> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffb0;
  RingBuffer<_PositionInfo__*> *in_stack_ffffffffffffffb8;
  ulong local_38;
  bool local_1;
  
  if (in_RDX == 0) {
    local_1 = false;
  }
  else {
    *(ulong *)(in_RDI + 0x18) = in_RDX;
    bVar1 = RingBuffer<_PositionInfo__*>::SetCapacity
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (bVar1) {
      *(ulong *)(in_RDI + 0x20) = in_RDX * 0x20 + 0x780;
      bVar1 = SharedMemoryManager::CreateShMem
                        (in_stack_00000148,in_stack_00000144,in_stack_00000138,in_stack_00000130);
      if (bVar1) {
        bVar1 = SharedMemoryManager::AttachShMem((SharedMemoryManager *)in_stack_ffffffffffffff88);
        if (bVar1) {
          pvVar2 = SharedMemoryManager::GetShMemStartAddr((SharedMemoryManager *)(in_RDI + 0x98));
          *(void **)(in_RDI + 0xd8) = pvVar2;
          pvVar2 = SharedMemoryManager::GetShMemStartAddr((SharedMemoryManager *)(in_RDI + 0x98));
          for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
            pp_Var3 = RingBuffer<_PositionInfo__*>::operator[]
                                (in_stack_ffffffffffffff90,(int64_t *)in_stack_ffffffffffffff88);
            *pp_Var3 = (_PositionInfo_ *)((long)pvVar2 + local_38 * 0x20 + 0x780);
          }
          **(undefined4 **)(in_RDI + 0xd8) = (int)in_RDX;
          *(int *)(*(long *)(in_RDI + 0xd8) + 4) = (int)*(undefined8 *)(in_RDI + 0x20);
          if (*(int *)(in_RDI + 0x28) == 0) {
            pvVar2 = operator_new(0x10);
            BlockingWaitStrategy::BlockingWaitStrategy
                      ((BlockingWaitStrategy *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            *(void **)(in_RDI + 0x30) = pvVar2;
          }
          else if (*(int *)(in_RDI + 0x28) == 1) {
            this_00 = (YieldingWaitStrategy *)operator_new(0x10);
            YieldingWaitStrategy::YieldingWaitStrategy(this_00,in_stack_ffffffffffffff88);
            *(YieldingWaitStrategy **)(in_RDI + 0x30) = this_00;
          }
          else {
            if (*(int *)(in_RDI + 0x28) != 2) {
              return false;
            }
            status_on_shared_mem = (StatusOnSharedMem *)operator_new(0x10);
            SleepingWaitStrategy::SleepingWaitStrategy
                      ((SleepingWaitStrategy *)in_stack_ffffffffffffff90,status_on_shared_mem);
            *(StatusOnSharedMem **)(in_RDI + 0x30) = status_on_shared_mem;
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SharedMemRingBuffer::InitIndexBuffer(key_t key_index_buffer, size_t size )
{
    if(size == 0) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    buffer_size_ = size;

    if(!ring_buffer_.SetCapacity(size) ) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    //shared memory consists of : StatusOnSharedMem + actual data
    total_mem_size_ = sizeof(_StatusOnSharedMem_)  + (sizeof(PositionInfo) * size) ;

    bool bSharedMemFirstCreated = false;
    if(! shared_index_buffer_.CreateShMem(key_index_buffer, total_mem_size_, &bSharedMemFirstCreated )) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }
    if(! shared_index_buffer_.AttachShMem()) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }

    ring_buffer_status_on_shared_mem_ = (StatusOnSharedMem*) shared_index_buffer_. GetShMemStartAddr(); 
    if(bSharedMemFirstCreated) {
        ResetRingBufferState();
    }
    char* buffer_start = (char*)shared_index_buffer_.GetShMemStartAddr() + sizeof(_StatusOnSharedMem_) ; 

    for(size_t i = 0; i < size; i++) {
        ring_buffer_[i] = (PositionInfo*) ( (char*)buffer_start + (sizeof(PositionInfo)*i) ) ;
    }

    ring_buffer_status_on_shared_mem_->nBufferSize = size;
    ring_buffer_status_on_shared_mem_->nTotalMemSize = total_mem_size_;

    //---------------------------------------------
    //wait strategy
    if(wait_strategy_type_ == BLOCKING_WAIT ) {
        DEBUG_LOG ("Wait Strategy :BLOCKING_WAIT" ); 
        wait_strategy_ = new BlockingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == YIELDING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :YIELDING_WAIT" ); 
        wait_strategy_ = new YieldingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == SLEEPING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :SLEEPING_WAIT" ); 
        wait_strategy_ = new SleepingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else {
        DEBUG_ELOG( "Invalid Wait Strategy :" << wait_strategy_type_); 
        return false;
    }
    return true;
}